

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_tweak_add
              (secp256k1_ecmult_context *ctx,secp256k1_ge *key,secp256k1_scalar *tweak)

{
  int iVar1;
  secp256k1_scalar one;
  secp256k1_gej pt;
  secp256k1_scalar *in_stack_00000b70;
  secp256k1_scalar *in_stack_00000b78;
  secp256k1_gej *in_stack_00000b80;
  secp256k1_gej *in_stack_00000b88;
  secp256k1_ecmult_context *in_stack_00000b90;
  secp256k1_ge *in_stack_ffffffffffffff38;
  secp256k1_gej *in_stack_ffffffffffffff40;
  secp256k1_gej *in_stack_ffffffffffffff88;
  secp256k1_ge *in_stack_ffffffffffffff90;
  uint local_4;
  
  secp256k1_gej_set_ge(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  secp256k1_scalar_set_int((secp256k1_scalar *)&stack0xffffffffffffff40,1);
  secp256k1_ecmult(in_stack_00000b90,in_stack_00000b88,in_stack_00000b80,in_stack_00000b78,
                   in_stack_00000b70);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    secp256k1_ge_set_gej(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_add(const secp256k1_ecmult_context *ctx, secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_gej pt;
    secp256k1_scalar one;
    secp256k1_gej_set_ge(&pt, key);
    secp256k1_scalar_set_int(&one, 1);
    secp256k1_ecmult(ctx, &pt, &pt, &one, tweak);

    if (secp256k1_gej_is_infinity(&pt)) {
        return 0;
    }
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}